

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

QRegion __thiscall QRegion::subtracted(QRegion *this,QRegion *r)

{
  int iVar1;
  int iVar2;
  QRegionPrivate *r1;
  QRegionPrivate *r2;
  bool bVar3;
  long *in_RDX;
  
  r1 = r->d->qt_rgn;
  if ((r1 != (QRegionPrivate *)0x0) && (r1->numRects != 0)) {
    r2 = ((QRegionData *)*in_RDX)->qt_rgn;
    if ((r2 != (QRegionPrivate *)0x0) && (r2->numRects != 0)) {
      iVar1 = (r1->extents).x1.m_i;
      iVar2 = (r1->extents).x2.m_i;
      if ((((iVar1 < (r2->innerRect).x1.m_i) || ((r2->innerRect).x2.m_i < iVar2)) ||
          ((r1->extents).y1.m_i < (r2->innerRect).y1.m_i)) ||
         ((r2->innerRect).y2.m_i < (r1->extents).y2.m_i)) {
        if ((((iVar2 < (r2->extents).x1.m_i) || ((r2->extents).x2.m_i < iVar1)) ||
            ((r1->extents).y2.m_i < (r2->extents).y1.m_i)) ||
           ((r2->extents).y2.m_i < (r1->extents).y1.m_i)) goto LAB_00429b73;
        if ((r->d != (QRegionData *)*in_RDX) && (bVar3 = EqualRegion(r1,r2), !bVar3)) {
          this->d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion(this);
          detach(this);
          SubtractRegion(r->d->qt_rgn,*(QRegionPrivate **)(*in_RDX + 8),this->d->qt_rgn);
          return (QRegion)(QRegionData *)this;
        }
      }
      QRegion(this);
      return (QRegion)(QRegionData *)this;
    }
  }
LAB_00429b73:
  QRegion(this,r);
  return (QRegion)(QRegionData *)this;
}

Assistant:

QRegion QRegion::subtracted(const QRegion &r) const
{
    if (isEmptyHelper(d->qt_rgn) || isEmptyHelper(r.d->qt_rgn))
        return *this;
    if (r.d->qt_rgn->contains(*d->qt_rgn))
        return QRegion();
    if (!EXTENTCHECK(&d->qt_rgn->extents, &r.d->qt_rgn->extents))
        return *this;
    if (d == r.d || EqualRegion(d->qt_rgn, r.d->qt_rgn))
        return QRegion();

#ifdef QT_REGION_DEBUG
    d->qt_rgn->selfTest();
    r.d->qt_rgn->selfTest();
#endif

    QRegion result;
    result.detach();
    SubtractRegion(d->qt_rgn, r.d->qt_rgn, *result.d->qt_rgn);
#ifdef QT_REGION_DEBUG
    result.d->qt_rgn->selfTest();
#endif
    return result;
}